

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O1

vector<float,_pstd::pmr::polymorphic_allocator<float>_> * __thiscall
pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator=
          (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *this,
          vector<float,_pstd::pmr::polymorphic_allocator<float>_> *other)

{
  size_t sVar1;
  float *pfVar2;
  float *pfVar3;
  size_t sVar4;
  
  if (this != other) {
    this->nStored = 0;
    reserve(this,other->nStored);
    sVar1 = other->nStored;
    if (sVar1 != 0) {
      pfVar2 = this->ptr;
      pfVar3 = other->ptr;
      sVar4 = 0;
      do {
        pfVar2[sVar4] = pfVar3[sVar4];
        sVar4 = sVar4 + 1;
      } while (sVar1 != sVar4);
    }
    this->nStored = sVar1;
  }
  return this;
}

Assistant:

vector &operator=(const vector &other) {
        if (this == &other)
            return *this;

        clear();
        reserve(other.size());
        for (size_t i = 0; i < other.size(); ++i)
            alloc.template construct<T>(ptr + i, other[i]);
        nStored = other.size();

        return *this;
    }